

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall gl4cts::GLSL420Pack::BindingImagesTest::releaseResource(BindingImagesTest *this)

{
  BindingImagesTest *this_local;
  
  Utils::texture::release(&this->m_goku_texture);
  Utils::texture::release(&this->m_vegeta_texture);
  Utils::texture::release(&this->m_trunks_texture);
  if (this->m_test_case != TEX_BUFFER) {
    Utils::buffer::release(&this->m_goku_buffer);
    Utils::buffer::release(&this->m_vegeta_buffer);
    Utils::buffer::release(&this->m_trunks_buffer);
  }
  return;
}

Assistant:

void BindingImagesTest::releaseResource()
{
	m_goku_texture.release();
	m_vegeta_texture.release();
	m_trunks_texture.release();
	if (m_test_case != Utils::TEX_BUFFER)
	{
		m_goku_buffer.release();
		m_vegeta_buffer.release();
		m_trunks_buffer.release();
	}
}